

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void do_interrupt_all(CPUM68KState_conflict *env,int is_hw)

{
  int iVar1;
  int is_hw_local;
  CPUM68KState_conflict *env_local;
  
  iVar1 = m68k_feature(env,0);
  if (iVar1 == 0) {
    cf_interrupt_all(env,is_hw);
  }
  else {
    m68k_interrupt_all(env,is_hw);
  }
  return;
}

Assistant:

static void do_interrupt_all(CPUM68KState *env, int is_hw)
{
    if (m68k_feature(env, M68K_FEATURE_M68000)) {
        m68k_interrupt_all(env, is_hw);
        return;
    }
    cf_interrupt_all(env, is_hw);
}